

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HelloWorld.cpp
# Opt level: O1

path * findDocRoot(path *__return_storage_ptr__,string *filename)

{
  pointer pcVar1;
  bool bVar2;
  _List _Var3;
  char cVar4;
  int iVar5;
  path *ppVar6;
  path *ppVar7;
  runtime_error *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  path *ppVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  bool bVar11;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  path cp;
  path local_b0;
  path local_88;
  path local_60;
  string *local_38;
  
  std::filesystem::current_path_abi_cxx11_();
  local_b0._M_pathname._M_dataplus._M_p = (pointer)&local_b0._M_pathname.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b0,local_88._M_pathname._M_dataplus._M_p,
             local_88._M_pathname._M_dataplus._M_p + local_88._M_pathname._M_string_length);
  ppVar7 = &local_b0;
  fmt._M_str = (char *)filename;
  fmt._M_len = (size_t)"Looking for {} in {}";
  webfront::log::info<std::__cxx11::string&,std::__cxx11::string>
            ((log *)0x14,fmt,&ppVar7->_M_pathname,in_R8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_pathname._M_dataplus._M_p != &local_b0._M_pathname.field_2) {
    operator_delete(local_b0._M_pathname._M_dataplus._M_p,
                    local_b0._M_pathname.field_2._M_allocated_capacity + 1);
  }
  webfront::http::std::filesystem::__cxx11::path::~path(&local_88);
  std::filesystem::current_path_abi_cxx11_();
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            (&local_60,filename,auto_format);
  webfront::http::std::filesystem::__cxx11::operator/(&local_88,&local_b0,&local_60);
  cVar4 = std::filesystem::status(&local_88);
  webfront::http::std::filesystem::__cxx11::path::~path(&local_88);
  webfront::http::std::filesystem::__cxx11::path::~path(&local_60);
  webfront::http::std::filesystem::__cxx11::path::~path(&local_b0);
  if ((cVar4 == '\0') || (cVar4 == -1)) {
    std::filesystem::temp_directory_path_abi_cxx11_();
    local_b0._M_pathname._M_dataplus._M_p = (pointer)&local_b0._M_pathname.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b0,local_88._M_pathname._M_dataplus._M_p,
               local_88._M_pathname._M_dataplus._M_p + local_88._M_pathname._M_string_length);
    fmt_00._M_str = (char *)&local_b0;
    fmt_00._M_len = (size_t)"  not found : Looking now in temp directory {} ";
    webfront::log::info<std::__cxx11::string>((log *)0x2f,fmt_00,&ppVar7->_M_pathname);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_pathname._M_dataplus._M_p != &local_b0._M_pathname.field_2) {
      operator_delete(local_b0._M_pathname._M_dataplus._M_p,
                      local_b0._M_pathname.field_2._M_allocated_capacity + 1);
    }
    webfront::http::std::filesystem::__cxx11::path::~path(&local_88);
    std::filesystem::temp_directory_path_abi_cxx11_();
    std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
              (&local_60,filename,auto_format);
    webfront::http::std::filesystem::__cxx11::operator/(&local_88,&local_b0,&local_60);
    cVar4 = std::filesystem::status(&local_88);
    webfront::http::std::filesystem::__cxx11::path::~path(&local_88);
    webfront::http::std::filesystem::__cxx11::path::~path(&local_60);
    webfront::http::std::filesystem::__cxx11::path::~path(&local_b0);
    if ((cVar4 == '\0') || (cVar4 == -1)) {
      webfront::http::std::filesystem::__cxx11::path::path(__return_storage_ptr__);
      std::filesystem::current_path_abi_cxx11_();
      bVar11 = ((byte)local_88._M_cmpts & 3) == 0;
      local_38 = filename;
      if (bVar11) {
        ppVar6 = (path *)std::filesystem::__cxx11::path::_List::begin();
      }
      else {
        ppVar6 = (path *)0x0;
      }
      bVar11 = !bVar11 && local_88._M_pathname._M_string_length == 0;
      while( true ) {
        ppVar10 = ppVar6;
        if (((byte)local_88._M_cmpts & 3) == 0) {
          ppVar7 = (path *)std::filesystem::__cxx11::path::_List::end();
          pbVar8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        }
        else {
          pbVar8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT71((int7)((ulong)ppVar7 >> 8),1);
          ppVar7 = (path *)0x0;
        }
        bVar2 = bVar11 != SUB81(pbVar8,0);
        if (((byte)local_88._M_cmpts & 3) == 0) {
          bVar2 = ppVar10 != ppVar7;
        }
        if (!bVar2) break;
        ppVar7 = &local_88;
        if (((byte)local_88._M_cmpts & 3) == 0) {
          ppVar7 = ppVar10;
        }
        webfront::http::std::filesystem::__cxx11::operator/(&local_b0,__return_storage_ptr__,ppVar7)
        ;
        if (&local_b0 != __return_storage_ptr__) {
          pbVar8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &__return_storage_ptr__->_M_cmpts;
          findDocRoot();
        }
        webfront::http::std::filesystem::__cxx11::path::~path(&local_b0);
        _Var3 = local_88._M_cmpts;
        std::filesystem::__cxx11::path::path<char[9],std::filesystem::__cxx11::path>
                  (&local_b0,(char (*) [9])"WebFront",auto_format);
        ppVar7 = &local_88;
        if (((byte)_Var3 & 3) == 0) {
          ppVar7 = ppVar10;
        }
        iVar5 = std::filesystem::__cxx11::path::compare(ppVar7);
        webfront::http::std::filesystem::__cxx11::path::~path(&local_b0);
        if (iVar5 == 0) {
          std::filesystem::__cxx11::path::path<char[4],std::filesystem::__cxx11::path>
                    (&local_60,(char (*) [4])"src",auto_format);
          webfront::http::std::filesystem::__cxx11::operator/
                    (&local_b0,__return_storage_ptr__,&local_60);
          if (&local_b0 != __return_storage_ptr__) {
            pbVar8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &__return_storage_ptr__->_M_cmpts;
            findDocRoot();
          }
          webfront::http::std::filesystem::__cxx11::path::~path(&local_b0);
          webfront::http::std::filesystem::__cxx11::path::~path(&local_60);
          pcVar1 = (__return_storage_ptr__->_M_pathname)._M_dataplus._M_p;
          local_b0._M_pathname._M_dataplus._M_p = (pointer)&local_b0._M_pathname.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_b0,pcVar1,
                     pcVar1 + (__return_storage_ptr__->_M_pathname)._M_string_length);
          fmt_01._M_str = (char *)&local_b0;
          fmt_01._M_len = (size_t)"  not found : Looking now in source directory {}";
          webfront::log::info<std::__cxx11::string>((log *)0x30,fmt_01,pbVar8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_pathname._M_dataplus._M_p != &local_b0._M_pathname.field_2) {
            operator_delete(local_b0._M_pathname._M_dataplus._M_p,
                            local_b0._M_pathname.field_2._M_allocated_capacity + 1);
          }
          std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
                    (&local_60,local_38,auto_format);
          webfront::http::std::filesystem::__cxx11::operator/
                    (&local_b0,__return_storage_ptr__,&local_60);
          cVar4 = std::filesystem::status(&local_b0);
          webfront::http::std::filesystem::__cxx11::path::~path(&local_b0);
          webfront::http::std::filesystem::__cxx11::path::~path(&local_60);
          if ((cVar4 != '\0') && (cVar4 != -1)) {
            webfront::http::std::filesystem::__cxx11::path::~path(&local_88);
            return __return_storage_ptr__;
          }
        }
        ppVar7 = (path *)0x0;
        ppVar6 = (path *)&ppVar10[1]._M_pathname._M_string_length;
        if (((byte)local_88._M_cmpts & 3) != 0) {
          bVar11 = true;
          ppVar6 = ppVar10;
        }
      }
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::operator+(&local_60._M_pathname,"Cannot find ",local_38);
      pbVar8 = webfront::http::std::__cxx11::
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                         (&local_60._M_pathname," file");
      local_b0._M_pathname._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
      paVar9 = &pbVar8->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_pathname._M_dataplus._M_p == paVar9) {
        local_b0._M_pathname.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
        local_b0._M_pathname.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
        local_b0._M_pathname._M_dataplus._M_p = (pointer)&local_b0._M_pathname.field_2;
      }
      else {
        local_b0._M_pathname.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
      }
      local_b0._M_pathname._M_string_length = pbVar8->_M_string_length;
      (pbVar8->_M_dataplus)._M_p = (pointer)paVar9;
      pbVar8->_M_string_length = 0;
      (pbVar8->field_2)._M_local_buf[0] = '\0';
      std::runtime_error::runtime_error(this,(string *)&local_b0);
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::filesystem::temp_directory_path_abi_cxx11_();
  }
  else {
    std::filesystem::current_path_abi_cxx11_();
  }
  return __return_storage_ptr__;
}

Assistant:

filesystem::path findDocRoot(string filename) {
    using namespace filesystem;

    log::info("Looking for {} in {}", filename, current_path().string());
    if (exists(current_path() / filename)) return current_path();

    log::info("  not found : Looking now in temp directory {} ", temp_directory_path().string());
    if (exists(temp_directory_path() / filename)) return temp_directory_path();

    path webfront, cp{current_path()};
    for (auto element = cp.begin(); element != cp.end(); ++element) {
        webfront = webfront / *element;
        if (*element == "WebFront") {
            webfront = webfront / "src";
            log::info("  not found : Looking now in source directory {}", webfront.string());
            if (exists(webfront / filename)) return webfront;
        }
    }

    throw runtime_error("Cannot find " + filename + " file");
}